

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O1

void uv__io_poll(uv_loop_t *loop,int timeout)

{
  long *plVar1;
  uv__iou *ctl;
  uv__queue *puVar2;
  int __epfd;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  uv__io_s *puVar7;
  uv_fs_t *req;
  uv__statx *statxbuf;
  bool bVar8;
  byte bVar9;
  uint uVar10;
  uv__queue *puVar11;
  int *piVar12;
  uint64_t uVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  epoll_event *__event;
  bool bVar20;
  epoll_event e;
  uv__invalidate inv;
  sigset_t sigset;
  epoll_event prep [256];
  epoll_event events [1024];
  uint local_3d58;
  int local_3d44;
  int local_3d10;
  epoll_event local_3d08;
  sigset_t *local_3cf8;
  uv__io_s *local_3cf0;
  uint64_t local_3ce8;
  ulong local_3ce0;
  ulong local_3cd8;
  epoll_event *local_3cd0;
  epoll_event *local_3cc8;
  uint local_3cc0;
  sigset_t local_3cb8;
  epoll_event local_3c38 [256];
  epoll_event local_3038 [768];
  
  puVar6 = (uint *)loop->internal_fields;
  if ((loop->flags & 1) == 0) {
    local_3cf8 = (sigset_t *)0x0;
  }
  else {
    sigemptyset(&local_3cb8);
    local_3cf8 = &local_3cb8;
    sigaddset(&local_3cb8,0x1b);
  }
  if (timeout < -1) {
    __assert_fail("timeout >= -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/linux.c"
                  ,0x52f,"void uv__io_poll(uv_loop_t *, int)");
  }
  ctl = (uv__iou *)(puVar6 + 0x32);
  local_3ce8 = loop->time;
  uVar17 = *puVar6;
  bVar20 = (uVar17 & 1) == 0;
  __epfd = loop->backend_fd;
  local_3d08.data.fd = 0;
  local_3d58 = 0;
  if (bVar20) {
    local_3d58 = timeout;
  }
  local_3d08.events = 0;
  local_3d08._4_4_ = 0;
  puVar2 = &loop->watcher_queue;
  puVar11 = (loop->watcher_queue).next;
  if (puVar11 != puVar2) {
    do {
      puVar11->prev->next = puVar11->next;
      puVar11->next->prev = puVar11->prev;
      puVar11->next = puVar11;
      puVar11->prev = puVar11;
      local_3d08.events = *(uint32_t *)&puVar11[1].next;
      iVar18 = *(int *)((long)&puVar11[1].next + 4);
      iVar16 = (iVar18 != 0) + 1 + (uint)(iVar18 != 0);
      *(uint32_t *)((long)&puVar11[1].next + 4) = local_3d08.events;
      iVar3 = *(int *)&puVar11[1].prev;
      local_3d08._4_4_ = iVar3;
      if (puVar6[0x50] == 0xffffffff) {
        iVar16 = epoll_ctl(__epfd,iVar16,iVar3,&local_3d08);
        if (iVar16 != 0) {
          if (iVar18 != 0) {
            __assert_fail("op == EPOLL_CTL_ADD",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/linux.c"
                          ,0x558,"void uv__io_poll(uv_loop_t *, int)");
          }
          piVar12 = __errno_location();
          if (*piVar12 != 0x11) {
            __assert_fail("errno == EEXIST",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/linux.c"
                          ,0x559,"void uv__io_poll(uv_loop_t *, int)");
          }
          iVar18 = epoll_ctl(__epfd,3,iVar3,&local_3d08);
          if (iVar18 != 0) {
            abort();
          }
        }
      }
      else {
        uv__epoll_ctl_prep(__epfd,ctl,&local_3c38,iVar16,iVar3,(epoll_event *)&local_3d08);
      }
      puVar11 = puVar2->next;
    } while (puVar11 != puVar2);
  }
  uVar17 = -(uVar17 & 1) & timeout;
  local_3cc8 = local_3038;
  local_3cd0 = local_3c38;
  local_3cc0 = 0xffffffff;
  local_3cf0 = &loop->signal_io_watcher;
  local_3d10 = 0x30;
  do {
    while( true ) {
      if ((loop->nfds == 0) && (puVar6[0x73] == 0)) goto LAB_0011c7a8;
      if (puVar6[0x50] != 0xffffffff) {
        while (**(int **)(puVar6 + 0x32) != **(int **)(puVar6 + 0x34)) {
          uv__epoll_ctl_flush(__epfd,ctl,&local_3c38);
        }
      }
      if (local_3d58 != 0) {
        uv__metrics_set_provider_entry_time(loop);
      }
      puVar6[0x30] = local_3d58;
      uVar10 = epoll_pwait(__epfd,local_3038,0x400,local_3d58,local_3cf8);
      piVar12 = __errno_location();
      iVar18 = *piVar12;
      uVar13 = uv__hrtime(UV_CLOCK_FAST);
      loop->time = uVar13 / 1000000;
      *piVar12 = iVar18;
      if (uVar10 == 0xffffffff) {
        if (iVar18 != 4) {
          __assert_fail("errno == EINTR",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/linux.c"
                        ,0x585,"void uv__io_poll(uv_loop_t *, int)");
        }
      }
      else if (local_3d58 == 0xffffffff && uVar10 == 0) {
        __assert_fail("timeout != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/linux.c"
                      ,0x588,"void uv__io_poll(uv_loop_t *, int)");
      }
      if (1 < uVar10 + 1) break;
      if (!bVar20) {
        local_3d58 = uVar17;
      }
      if ((bool)(bVar20 & uVar10 == 0)) {
        return;
      }
LAB_0011c73a:
      bVar20 = true;
      if (local_3d58 != 0xffffffff) {
        if (local_3d58 == 0) goto LAB_0011c7a8;
        if ((int)local_3d58 < 1) {
          __assert_fail("timeout > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/linux.c"
                        ,0x60b,"void uv__io_poll(uv_loop_t *, int)");
        }
        local_3d58 = timeout + ((int)local_3ce8 - (int)loop->time);
        bVar20 = true;
        timeout = local_3d58;
        if ((int)local_3d58 < 1) goto LAB_0011c7a8;
      }
    }
    *(epoll_event ***)(puVar6 + 0x76) = &local_3cd0;
    local_3ce0 = (ulong)uVar10;
    local_3cc0 = uVar10;
    if ((int)uVar10 < 1) {
      bVar9 = 0;
      bVar8 = false;
      local_3d44 = 0;
    }
    else {
      local_3cd8 = (ulong)uVar10;
      uVar15 = 0;
      local_3d44 = 0;
      bVar8 = false;
      bVar9 = 0;
      do {
        uVar10 = *(uint *)(&local_3038[0].field_0x4 + uVar15 * 0xc);
        if ((ulong)uVar10 != 0xffffffff) {
          if (uVar10 == puVar6[0x72]) {
            uVar10 = **(uint **)(puVar6 + 0x5e);
            uVar4 = **(uint **)(puVar6 + 0x60);
            if (uVar10 == uVar4) {
              lVar19 = 0;
            }
            else {
              uVar5 = puVar6[0x62];
              lVar19 = *(long *)(puVar6 + 0x66);
              iVar18 = 0;
              do {
                lVar14 = (ulong)(uVar10 & uVar5) * 0x10;
                req = *(uv_fs_t **)(lVar19 + lVar14);
                if (req->type != UV_FS) {
                  __assert_fail("req->type == UV_FS",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/linux.c"
                                ,0x467,"void uv__poll_io_uring(uv_loop_t *, struct uv__iou *)");
                }
                if ((loop->active_reqs).count == 0) {
                  __assert_fail("uv__has_active_reqs(loop)",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/linux.c"
                                ,0x469,"void uv__poll_io_uring(uv_loop_t *, struct uv__iou *)");
                }
                (loop->active_reqs).count = (loop->active_reqs).count - 1;
                puVar6[0x73] = puVar6[0x73] - 1;
                iVar3 = *(int *)(lVar14 + lVar19 + 8);
                if ((long)iVar3 == -0x5f) {
                  uv__fs_post(loop,req);
                }
                else {
                  req->result = (long)iVar3;
                  if ((uint)(req->fs_type + ~UV_FS_SENDFILE) < 3) {
                    statxbuf = (uv__statx *)req->ptr;
                    req->ptr = (void *)0x0;
                    if (iVar3 == 0) {
                      uv__statx_to_stat(statxbuf,&req->statbuf);
                      req->ptr = &req->statbuf;
                    }
                    uv__free(statxbuf);
                  }
                  uv__metrics_update_idle_time(loop);
                  (*req->cb)(req);
                  iVar18 = iVar18 + 1;
                }
                uVar10 = uVar10 + 1;
              } while (uVar4 != uVar10);
              lVar19 = (long)iVar18;
            }
            **(uint **)(puVar6 + 0x5e) = uVar4;
            if ((**(uint **)(puVar6 + 0x5c) & 2) != 0) {
              do {
                lVar14 = syscall(0x1aa,(ulong)puVar6[0x72],0,0,1,0,0);
                if ((int)lVar14 != -1) break;
              } while (*piVar12 == 4);
              if ((int)lVar14 < 0) {
                perror("libuv: io_uring_enter(getevents)");
              }
            }
            plVar1 = (long *)((long)loop->internal_fields + 0x10);
            *plVar1 = *plVar1 + lVar19;
            bVar9 = 1;
            if (*(int *)((long)loop->internal_fields + 0xc0) == 0) {
              plVar1 = (long *)((long)loop->internal_fields + 0x18);
              *plVar1 = *plVar1 + lVar19;
            }
          }
          else {
            if ((int)uVar10 < 0) {
              __assert_fail("fd >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/linux.c"
                            ,0x5ab,"void uv__io_poll(uv_loop_t *, int)");
            }
            if (loop->nwatchers <= uVar10) {
              __assert_fail("(unsigned) fd < loop->nwatchers",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/linux.c"
                            ,0x5ac,"void uv__io_poll(uv_loop_t *, int)");
            }
            __event = (epoll_event *)(&local_3038[0].events + uVar15 * 3);
            puVar7 = loop->watchers[uVar10];
            if (puVar7 == (uv__io_s *)0x0) {
              epoll_ctl(__epfd,2,uVar10,__event);
            }
            else {
              uVar10 = (puVar7->pevents | 0x18) & __event->events;
              __event->events = uVar10;
              if ((uVar10 == 0x10) || (uVar10 == 8)) {
                __event->events = puVar7->pevents & 0x2007 | uVar10;
              }
              if (__event->events != 0) {
                if (puVar7 == local_3cf0) {
                  bVar8 = true;
                }
                else {
                  uv__metrics_update_idle_time(loop);
                  (*puVar7->cb)(loop,puVar7,__event->events);
                }
                local_3d44 = local_3d44 + 1;
              }
            }
          }
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != local_3cd8);
    }
    plVar1 = (long *)((long)loop->internal_fields + 0x10);
    *plVar1 = *plVar1 + (long)local_3d44;
    if (!bVar20) {
      plVar1 = (long *)((long)loop->internal_fields + 0x18);
      *plVar1 = *plVar1 + (long)local_3d44;
      local_3d58 = uVar17;
    }
    if (bVar8) {
      uv__metrics_update_idle_time(loop);
      (*(loop->signal_io_watcher).cb)(loop,local_3cf0,1);
    }
    puVar6[0x76] = 0;
    puVar6[0x77] = 0;
    if ((bool)(bVar8 | bVar9)) break;
    if (local_3d44 == 0) goto LAB_0011c73a;
    if ((int)local_3ce0 != 0x400) break;
    local_3d58 = 0;
    bVar20 = true;
    local_3d10 = local_3d10 + -1;
  } while (local_3d10 != 0);
LAB_0011c7a8:
  if ((puVar6[0x50] != 0xffffffff) && (**(int **)(puVar6 + 0x32) != **(int **)(puVar6 + 0x34))) {
    do {
      uv__epoll_ctl_flush(__epfd,ctl,&local_3c38);
    } while (**(int **)(puVar6 + 0x32) != **(int **)(puVar6 + 0x34));
  }
  return;
}

Assistant:

void uv__io_poll(uv_loop_t* loop, int timeout) {
  uv__loop_internal_fields_t* lfields;
  struct epoll_event events[1024];
  struct epoll_event prep[256];
  struct uv__invalidate inv;
  struct epoll_event* pe;
  struct epoll_event e;
  struct uv__iou* ctl;
  struct uv__iou* iou;
  int real_timeout;
  struct uv__queue* q;
  uv__io_t* w;
  sigset_t* sigmask;
  sigset_t sigset;
  uint64_t base;
  int have_iou_events;
  int have_signals;
  int nevents;
  int epollfd;
  int count;
  int nfds;
  int fd;
  int op;
  int i;
  int user_timeout;
  int reset_timeout;

  lfields = uv__get_internal_fields(loop);
  ctl = &lfields->ctl;
  iou = &lfields->iou;

  sigmask = NULL;
  if (loop->flags & UV_LOOP_BLOCK_SIGPROF) {
    sigemptyset(&sigset);
    sigaddset(&sigset, SIGPROF);
    sigmask = &sigset;
  }

  assert(timeout >= -1);
  base = loop->time;
  count = 48; /* Benchmarks suggest this gives the best throughput. */
  real_timeout = timeout;

  if (lfields->flags & UV_METRICS_IDLE_TIME) {
    reset_timeout = 1;
    user_timeout = timeout;
    timeout = 0;
  } else {
    reset_timeout = 0;
    user_timeout = 0;
  }

  epollfd = loop->backend_fd;

  memset(&e, 0, sizeof(e));

  while (!uv__queue_empty(&loop->watcher_queue)) {
    q = uv__queue_head(&loop->watcher_queue);
    w = uv__queue_data(q, uv__io_t, watcher_queue);
    uv__queue_remove(q);
    uv__queue_init(q);

    op = EPOLL_CTL_MOD;
    if (w->events == 0)
      op = EPOLL_CTL_ADD;

    w->events = w->pevents;
    e.events = w->pevents;
    e.data.fd = w->fd;
    fd = w->fd;

    if (ctl->ringfd != -1) {
      uv__epoll_ctl_prep(epollfd, ctl, &prep, op, fd, &e);
      continue;
    }

    if (!epoll_ctl(epollfd, op, fd, &e))
      continue;

    assert(op == EPOLL_CTL_ADD);
    assert(errno == EEXIST);

    /* File descriptor that's been watched before, update event mask. */
    if (epoll_ctl(epollfd, EPOLL_CTL_MOD, fd, &e))
      abort();
  }

  inv.events = events;
  inv.prep = &prep;
  inv.nfds = -1;

  for (;;) {
    if (loop->nfds == 0)
      if (iou->in_flight == 0)
        break;

    /* All event mask mutations should be visible to the kernel before
     * we enter epoll_pwait().
     */
    if (ctl->ringfd != -1)
      while (*ctl->sqhead != *ctl->sqtail)
        uv__epoll_ctl_flush(epollfd, ctl, &prep);

    /* Only need to set the provider_entry_time if timeout != 0. The function
     * will return early if the loop isn't configured with UV_METRICS_IDLE_TIME.
     */
    if (timeout != 0)
      uv__metrics_set_provider_entry_time(loop);

    /* Store the current timeout in a location that's globally accessible so
     * other locations like uv__work_done() can determine whether the queue
     * of events in the callback were waiting when poll was called.
     */
    lfields->current_timeout = timeout;

    nfds = epoll_pwait(epollfd, events, ARRAY_SIZE(events), timeout, sigmask);

    /* Update loop->time unconditionally. It's tempting to skip the update when
     * timeout == 0 (i.e. non-blocking poll) but there is no guarantee that the
     * operating system didn't reschedule our process while in the syscall.
     */
    SAVE_ERRNO(uv__update_time(loop));

    if (nfds == -1)
      assert(errno == EINTR);
    else if (nfds == 0)
      /* Unlimited timeout should only return with events or signal. */
      assert(timeout != -1);

    if (nfds == 0 || nfds == -1) {
      if (reset_timeout != 0) {
        timeout = user_timeout;
        reset_timeout = 0;
      } else if (nfds == 0) {
        return;
      }

      /* Interrupted by a signal. Update timeout and poll again. */
      goto update_timeout;
    }

    have_iou_events = 0;
    have_signals = 0;
    nevents = 0;

    inv.nfds = nfds;
    lfields->inv = &inv;

    for (i = 0; i < nfds; i++) {
      pe = events + i;
      fd = pe->data.fd;

      /* Skip invalidated events, see uv__platform_invalidate_fd */
      if (fd == -1)
        continue;

      if (fd == iou->ringfd) {
        uv__poll_io_uring(loop, iou);
        have_iou_events = 1;
        continue;
      }

      assert(fd >= 0);
      assert((unsigned) fd < loop->nwatchers);

      w = loop->watchers[fd];

      if (w == NULL) {
        /* File descriptor that we've stopped watching, disarm it.
         *
         * Ignore all errors because we may be racing with another thread
         * when the file descriptor is closed.
         *
         * Perform EPOLL_CTL_DEL immediately instead of going through
         * io_uring's submit queue, otherwise the file descriptor may
         * be closed by the time the kernel starts the operation.
         */
        epoll_ctl(epollfd, EPOLL_CTL_DEL, fd, pe);
        continue;
      }

      /* Give users only events they're interested in. Prevents spurious
       * callbacks when previous callback invocation in this loop has stopped
       * the current watcher. Also, filters out events that users has not
       * requested us to watch.
       */
      pe->events &= w->pevents | POLLERR | POLLHUP;

      /* Work around an epoll quirk where it sometimes reports just the
       * EPOLLERR or EPOLLHUP event.  In order to force the event loop to
       * move forward, we merge in the read/write events that the watcher
       * is interested in; uv__read() and uv__write() will then deal with
       * the error or hangup in the usual fashion.
       *
       * Note to self: happens when epoll reports EPOLLIN|EPOLLHUP, the user
       * reads the available data, calls uv_read_stop(), then sometime later
       * calls uv_read_start() again.  By then, libuv has forgotten about the
       * hangup and the kernel won't report EPOLLIN again because there's
       * nothing left to read.  If anything, libuv is to blame here.  The
       * current hack is just a quick bandaid; to properly fix it, libuv
       * needs to remember the error/hangup event.  We should get that for
       * free when we switch over to edge-triggered I/O.
       */
      if (pe->events == POLLERR || pe->events == POLLHUP)
        pe->events |=
          w->pevents & (POLLIN | POLLOUT | UV__POLLRDHUP | UV__POLLPRI);

      if (pe->events != 0) {
        /* Run signal watchers last.  This also affects child process watchers
         * because those are implemented in terms of signal watchers.
         */
        if (w == &loop->signal_io_watcher) {
          have_signals = 1;
        } else {
          uv__metrics_update_idle_time(loop);
          w->cb(loop, w, pe->events);
        }

        nevents++;
      }
    }

    uv__metrics_inc_events(loop, nevents);
    if (reset_timeout != 0) {
      timeout = user_timeout;
      reset_timeout = 0;
      uv__metrics_inc_events_waiting(loop, nevents);
    }

    if (have_signals != 0) {
      uv__metrics_update_idle_time(loop);
      loop->signal_io_watcher.cb(loop, &loop->signal_io_watcher, POLLIN);
    }

    lfields->inv = NULL;

    if (have_iou_events != 0)
      break;  /* Event loop should cycle now so don't poll again. */

    if (have_signals != 0)
      break;  /* Event loop should cycle now so don't poll again. */

    if (nevents != 0) {
      if (nfds == ARRAY_SIZE(events) && --count != 0) {
        /* Poll for more events but don't block this time. */
        timeout = 0;
        continue;
      }
      break;
    }

update_timeout:
    if (timeout == 0)
      break;

    if (timeout == -1)
      continue;

    assert(timeout > 0);

    real_timeout -= (loop->time - base);
    if (real_timeout <= 0)
      break;

    timeout = real_timeout;
  }

  if (ctl->ringfd != -1)
    while (*ctl->sqhead != *ctl->sqtail)
      uv__epoll_ctl_flush(epollfd, ctl, &prep);
}